

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

RK_S32 mpi_enc_opt_speed(void *ctx,char *next)

{
  int iVar1;
  MpiEncTestArgs *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid speed mode\n",0);
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0xd8) = iVar1;
    if ((3 < *(int *)((long)ctx + 0xd8)) || (*(int *)((long)ctx + 0xd8) < 0)) {
      *(undefined4 *)((long)ctx + 0xd8) = 0;
      _mpp_log_l(2,"mpi_enc_utils","invalid speed %d set to default 0\n",0,
                 *(undefined4 *)((long)ctx + 0xd8));
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_enc_opt_speed(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        cmd->speed = atoi(next);
        if (cmd->speed > 3 || cmd->speed < 0) {
            cmd->speed = 0;
            mpp_err("invalid speed %d set to default 0\n", cmd->speed);
        }
        return 1;
    }

    mpp_err("invalid speed mode\n");
    return 0;
}